

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

bool __thiscall UtestShell::match(UtestShell *this,char *target,TestFilter *filters)

{
  bool bVar1;
  TestFilter *in_RDX;
  char *in_stack_ffffffffffffffa8;
  SimpleString *name;
  uint in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  SimpleString local_30;
  TestFilter *local_20;
  bool local_1;
  
  local_20 = in_RDX;
  if (in_RDX == (TestFilter *)0x0) {
    local_1 = true;
  }
  else {
    for (; local_20 != (TestFilter *)0x0; local_20 = TestFilter::getNext(local_20)) {
      name = &local_30;
      SimpleString::SimpleString(&local_20->filter_,in_stack_ffffffffffffffa8);
      bVar1 = TestFilter::match((TestFilter *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),name);
      in_stack_ffffffffffffffc0 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc0);
      SimpleString::~SimpleString((SimpleString *)0x1817bc);
      if ((in_stack_ffffffffffffffc0 & 0x1000000) != 0) {
        return true;
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool UtestShell::match(const char* target, const TestFilter* filters) const
{
    if(filters == NULLPTR) return true;

    for(; filters != NULLPTR; filters = filters->getNext())
        if(filters->match(target)) return true;

    return false;
}